

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexical.h
# Opt level: O0

void __thiscall Node::Node(Node *this)

{
  Node *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::vector<Node,_std::allocator<Node>_>::vector(&this->son);
  std::__cxx11::string::operator=((string *)this,"");
  this->id = 0;
  this->to = -1;
  this->fr = -1;
  return;
}

Assistant:

Node() {
		name = "";
		id = 0;
		fr = to = -1;
	}